

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O3

void __thiscall
ikfast::IkSolution<double>::GetSolution
          (IkSolution<double> *this,double *solution,double *freevalues)

{
  pointer pIVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  pIVar1 = (this->_vbasesol).
           super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->_vbasesol).
                super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 3) * -0x5555555555555555;
    pcVar2 = &pIVar1->freeind;
    lVar4 = 0;
    do {
      if ((long)*pcVar2 < 0) {
        dVar5 = *(double *)(pcVar2 + -8);
LAB_00113472:
        solution[lVar4] = dVar5;
      }
      else {
        dVar5 = freevalues[*pcVar2] * ((IkSingleDOFSolutionBase<double> *)(pcVar2 + -0x10))->fmul +
                *(double *)(pcVar2 + -8);
        solution[lVar4] = dVar5;
        if (3.14159265358979 < dVar5) {
          dVar5 = dVar5 + -6.28318530717959;
          goto LAB_00113472;
        }
        if (dVar5 < -3.14159265358979) {
          dVar5 = dVar5 + 6.28318530717959;
          goto LAB_00113472;
        }
      }
      lVar4 = lVar4 + 1;
      pcVar2 = pcVar2 + 0x18;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  return;
}

Assistant:

virtual void GetSolution(T* solution, const T* freevalues) const {
        for(std::size_t i = 0; i < _vbasesol.size(); ++i) {
            if( _vbasesol[i].freeind < 0 )
                solution[i] = _vbasesol[i].foffset;
            else {
                solution[i] = freevalues[_vbasesol[i].freeind]*_vbasesol[i].fmul + _vbasesol[i].foffset;
                if( solution[i] > T(3.14159265358979) ) {
                    solution[i] -= T(6.28318530717959);
                }
                else if( solution[i] < T(-3.14159265358979) ) {
                    solution[i] += T(6.28318530717959);
                }
            }
        }
    }